

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O3

int createBoxConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  pointer pvVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  pointer pvVar8;
  ulong uVar9;
  long lVar10;
  pointer pvVar11;
  pointer pvVar12;
  int rowDelta;
  long lVar13;
  bool bVar14;
  
  uVar3 = (ulong)(uint)header;
  pvVar4 = (coverMatrix->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 1;
  do {
    pvVar8 = pvVar4;
    uVar9 = 1;
    do {
      uVar3 = (ulong)(int)uVar3;
      lVar10 = 1;
      pvVar11 = pvVar8;
      do {
        iVar2 = (int)uVar3;
        iVar5 = iVar2 + 0x3f;
        if (-1 < iVar2) {
          iVar5 = iVar2;
        }
        lVar13 = 0;
        pvVar12 = pvVar11;
        do {
          lVar6 = 0;
          do {
            puVar1 = (ulong *)((ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8 +
                              *(long *)((long)&(pvVar12->super__Bvector_base<std::allocator<bool>_>)
                                               ._M_impl.super__Bvector_impl_data + lVar6) +
                              (long)(iVar5 >> 6) * 8);
            *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
            lVar6 = lVar6 + 0x168;
          } while (lVar6 != 0x438);
          lVar13 = lVar13 + 1;
          pvVar12 = pvVar12 + 0x51;
        } while (lVar13 != 3);
        lVar10 = lVar10 + 1;
        uVar3 = uVar3 + 1;
        pvVar11 = pvVar11 + 1;
      } while (lVar10 != 10);
      pvVar8 = pvVar8 + 0x1b;
      bVar14 = uVar9 < 7;
      uVar9 = uVar9 + 3;
    } while (bVar14);
    pvVar4 = pvVar4 + 0xf3;
    bVar14 = uVar7 < 7;
    uVar7 = uVar7 + 3;
  } while (bVar14);
  return (int)uVar3;
}

Assistant:

int createBoxConstraints(vector<vector<bool> > &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row += BOX_SIZE) {
      for (int column = COVER_START_INDEX; column <= SIZE; column += BOX_SIZE) {
        for (int n = COVER_START_INDEX; n <= SIZE; n++, header++) {
          for (int rowDelta = 0; rowDelta < BOX_SIZE; rowDelta++) {
            for (int columnDelta = 0; columnDelta < BOX_SIZE; columnDelta++) {
              int index = indexInCoverMatrix(row + rowDelta, column + columnDelta, n);
              //matrix[index][header] = 1;
              coverMatrix[index][header] = true;
            }
          }
        }
      }
    }
    return header;
}